

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O2

void Ssw_FramesConstrainNode
               (Ssw_Man_t *p,Aig_Man_t *pFrames,Aig_Man_t *pAig,Aig_Obj_t *pObj,int iFrame,
               int fTwoPos)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t **ppAVar2;
  uint __line;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  char *__assertion;
  ulong uVar7;
  
  if (pAig->pReprs != (Aig_Obj_t **)0x0) {
    iVar5 = pObj->Id;
    pAVar1 = pAig->pReprs[iVar5];
    if (pAVar1 != (Aig_Obj_t *)0x0) {
      p->nConstrTotal = p->nConstrTotal + 1;
      if (iVar5 <= pAVar1->Id) {
        __assertion = "pObjRepr->Id < pObj->Id";
        __line = 0x61;
LAB_004dfde0:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                      ,__line,
                      "void Ssw_FramesConstrainNode(Ssw_Man_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int, int)"
                     );
      }
      ppAVar2 = p->pNodeToFrames;
      iVar5 = iVar5 * p->nFrames + iFrame;
      pAVar4 = ppAVar2[iVar5];
      pAVar6 = ppAVar2[pAVar1->Id * p->nFrames + iFrame];
      if (((*(uint *)&pAVar1->field_0x18 ^ *(uint *)&pObj->field_0x18) & 8) == 0) {
        pAVar3 = pAVar6;
        if (pAVar4 == (Aig_Obj_t *)((ulong)pAVar6 ^ 1)) {
          __assertion = "pObjNew != Aig_Not(pObjReprNew)";
          __line = 0x69;
          goto LAB_004dfde0;
        }
      }
      else {
        if (pAVar4 == pAVar6) {
          __assertion = "pObjNew != pObjReprNew";
          __line = 0x6f;
          goto LAB_004dfde0;
        }
        pAVar3 = (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
      }
      if (pAVar4 != pAVar3) {
        p->nConstrReduced = p->nConstrReduced + 1;
        pAVar6 = (Aig_Obj_t *)
                 ((ulong)((*(uint *)&pAVar1->field_0x18 ^ *(uint *)&pObj->field_0x18) >> 3 & 1) ^
                 (ulong)pAVar6);
        ppAVar2[iVar5] = pAVar6;
        if (fTwoPos == 0) {
          pAVar4 = Aig_Exor(pFrames,pAVar4,pAVar6);
          if (pAVar4 == (Aig_Obj_t *)0x0) {
            uVar7 = 1;
          }
          else {
            uVar7 = (ulong)(((uint)pAVar4 ^
                            *(uint *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18) >> 3) & 1);
          }
          pAVar4 = (Aig_Obj_t *)(uVar7 ^ (ulong)pAVar4);
        }
        else {
          Aig_ObjCreateCo(pFrames,pAVar6);
        }
        Aig_ObjCreateCo(pFrames,pAVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

static inline void Ssw_FramesConstrainNode( Ssw_Man_t * p, Aig_Man_t * pFrames, Aig_Man_t * pAig, Aig_Obj_t * pObj, int iFrame, int fTwoPos )
{
    Aig_Obj_t * pObjNew, * pObjNew2, * pObjRepr, * pObjReprNew, * pMiter;
    // skip nodes without representative
    pObjRepr = Aig_ObjRepr(pAig, pObj);
    if ( pObjRepr == NULL )
        return;
    p->nConstrTotal++;
    assert( pObjRepr->Id < pObj->Id );
    // get the new node
    pObjNew = Ssw_ObjFrame( p, pObj, iFrame );
    // get the new node of the representative
    pObjReprNew = Ssw_ObjFrame( p, pObjRepr, iFrame );
    // if this is the same node, no need to add constraints
    if ( pObj->fPhase == pObjRepr->fPhase )
    {
        assert( pObjNew != Aig_Not(pObjReprNew) );
        if ( pObjNew == pObjReprNew )
            return;
    }
    else
    {
        assert( pObjNew != pObjReprNew );
        if ( pObjNew == Aig_Not(pObjReprNew) )
            return;
    }
    p->nConstrReduced++;
    // these are different nodes - perform speculative reduction
    pObjNew2 = Aig_NotCond( pObjReprNew, pObj->fPhase ^ pObjRepr->fPhase );
    // set the new node
    Ssw_ObjSetFrame( p, pObj, iFrame, pObjNew2 );
    // add the constraint
    if ( fTwoPos )
    {
        Aig_ObjCreateCo( pFrames, pObjNew2 );
        Aig_ObjCreateCo( pFrames, pObjNew );
    }
    else
    {
        pMiter = Aig_Exor( pFrames, pObjNew, pObjNew2 );
        Aig_ObjCreateCo( pFrames, Aig_NotCond(pMiter, Aig_ObjPhaseReal(pMiter)) );
    }
}